

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O3

char * loopconc(ident *id,int n,uint *body,bool space)

{
  uint *puVar1;
  anon_union_8_3_558327c1_for_ident_6 *paVar2;
  char *__src;
  size_t sVar3;
  char *__dest;
  void *pvVar4;
  string *__s;
  int iVar5;
  ulong __n;
  vector<char> s;
  tagval v;
  identstack stack;
  vector<char> local_78;
  anon_union_8_5_08252708_for_identval_0 local_68;
  int local_60;
  stringformatter local_58;
  uint *local_50;
  anon_union_8_3_558327c1_for_ident_6 local_48;
  anon_union_4_3_c060dbb1_for_ident_2 local_40;
  anon_union_8_3_5b305ad5_for_ident_8 local_38;
  
  local_78.buf = (char *)0x0;
  local_78.alen = 0;
  local_78.ulen = 0;
  local_50 = body;
  if (0 < n) {
    iVar5 = 0;
    do {
      if (iVar5 == 0) {
        local_48 = id->field_4;
        local_40 = id->field_2;
        local_38 = id->field_5;
        (id->field_5).stack = (identstack *)&local_48;
        (id->field_2).minval = 1;
        (id->field_4).args = (char *)0x0;
        puVar1 = (id->field_3).code;
        if (puVar1 != (uint *)0x0) {
          *puVar1 = *puVar1 - 0x100;
          if ((int)*(id->field_3).code < 0x100) {
            operator_delete__((id->field_3).code);
          }
          (id->field_3).code = (uint *)0x0;
        }
        *(byte *)&id->flags = (byte)id->flags & 0xdf;
      }
      else {
        if ((id->field_2).minval != 1) {
          if (((id->field_2).minval == 3) && ((id->field_4).args != (char *)0x0)) {
            operator_delete__((id->field_4).args);
          }
          puVar1 = (id->field_3).code;
          if (puVar1 != (uint *)0x0) {
            *puVar1 = *puVar1 - 0x100;
            if ((int)*(id->field_3).code < 0x100) {
              operator_delete__((id->field_3).code);
            }
            (id->field_3).code = (uint *)0x0;
          }
          (id->field_2).minval = 1;
        }
        *(int *)&id->field_4 = iVar5;
      }
      runcode(local_50,(tagval *)&local_68);
      __s = (string *)0x16c804;
      switch(local_60) {
      case 1:
        retidx = retidx + ((retidx + 1U) / 3) * -3 + 1;
        local_58.buf = retbuf[(uint)retidx];
        stringformatter::operator()(&local_58,"%d",(ulong)(uint)local_68.i);
        __s = retbuf + (uint)retidx;
        break;
      case 2:
        __s = (string *)floatstr(local_68.f);
        break;
      case 3:
      case 6:
        __s = (string *)CONCAT44(local_68._4_4_,local_68.i);
      }
      sVar3 = strlen(*__s);
      if (iVar5 != 0 && space) {
        local_58.buf._0_1_ = 0x20;
        vector<char>::add(&local_78,(char *)&local_58);
      }
      vector<char>::put(&local_78,*__s,(int)sVar3);
      pvVar4 = (void *)CONCAT44(local_68._4_4_,local_68.i);
      if (local_60 == 5) {
        if (*(int *)((long)pvVar4 + -4) == 0) {
          pvVar4 = (void *)((long)pvVar4 + -4);
          goto LAB_0012c9cb;
        }
      }
      else if ((local_60 == 3) && (pvVar4 != (void *)0x0)) {
LAB_0012c9cb:
        operator_delete__(pvVar4);
      }
      iVar5 = iVar5 + 1;
    } while (n != iVar5);
  }
  paVar2 = (anon_union_8_3_558327c1_for_ident_6 *)(id->field_5).stack;
  if (paVar2 != (anon_union_8_3_558327c1_for_ident_6 *)0x0) {
    if (((id->field_2).minval == 3) && ((id->field_4).args != (char *)0x0)) {
      operator_delete__((id->field_4).args);
    }
    id->field_2 = *(anon_union_4_3_c060dbb1_for_ident_2 *)(paVar2 + 1);
    id->field_4 = *paVar2;
    puVar1 = (id->field_3).code;
    if (puVar1 != (uint *)0x0) {
      *puVar1 = *puVar1 - 0x100;
      if ((int)*(id->field_3).code < 0x100) {
        operator_delete__((id->field_3).code);
      }
      (id->field_3).code = (uint *)0x0;
    }
    id->field_5 = (anon_union_8_3_5b305ad5_for_ident_8)paVar2[2];
  }
  local_68.i = local_68.i & 0xffffff00;
  vector<char>::add(&local_78,(char *)&local_68.i);
  __src = local_78.buf;
  __n = (ulong)local_78.ulen;
  __dest = (char *)operator_new__(__n);
  strncpy(__dest,__src,__n);
  __dest[__n - 1] = '\0';
  local_78._8_8_ = local_78._8_8_ & 0xffffffff;
  if (__src != (char *)0x0) {
    operator_delete__(__src);
  }
  return __dest;
}

Assistant:

char *loopconc(ident *id, int n, uint *body, bool space)
{
    identstack stack;
    vector<char> s;
    loopi(n)
    {
        setiter(*id, i, stack);
        tagval v;
        executeret(body, v);
        const char *vstr = v.getstr();
        int len = strlen(vstr);
        if(space && i) s.add(' ');
        s.put(vstr, len);
        freearg(v);
    }
    poparg(*id);
    s.add('\0');
    return newstring(s.getbuf(), s.length()-1);
}